

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::utp_socket_manager::remove_udp_socket
          (utp_socket_manager *this,weak_ptr<libtorrent::aux::utp_socket_interface> *sock)

{
  element_type *peVar1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  shared_ptr<libtorrent::aux::utp_socket_interface> iface;
  __shared_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ::std::__shared_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_50);
  for (p_Var3 = (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3)) {
    ::std::__shared_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_40,p_Var3[1]._M_parent);
    peVar2 = local_40._M_ptr;
    peVar1 = local_50._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (peVar2 == peVar1) {
      utp_socket_impl::abort((utp_socket_impl *)p_Var3[1]._M_parent);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void utp_socket_manager::remove_udp_socket(std::weak_ptr<utp_socket_interface> sock)
	{
		auto iface = sock.lock();
		for (auto& s : m_utp_sockets)
		{
			if (s.second->m_sock.lock() != iface)
				continue;

			s.second->abort();
		}
	}